

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O2

FT_Error tt_size_init(FT_Size ttsize)

{
  ttsize[6].generic.data = (void *)0xffffffffffffffff;
  *(undefined1 *)&ttsize[2].metrics.ascender = 0;
  ttsize[2].metrics.descender = 0xffffffff;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_init( FT_Size  ttsize )           /* TT_Size */
  {
    TT_Size   size  = (TT_Size)ttsize;
    FT_Error  error = FT_Err_Ok;


#ifdef TT_USE_BYTECODE_INTERPRETER
    size->bytecode_ready = -1;
    size->cvt_ready      = -1;
#endif

    size->ttmetrics.valid = FALSE;
    size->strike_index    = 0xFFFFFFFFUL;

    return error;
  }